

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O0

TrodesMsg * new_TrodesMsg(str *f,list *l)

{
  result_type rVar1;
  result_type rVar2;
  result_type pbVar3;
  undefined1 *puVar4;
  result_type rVar5;
  TrodesMsg *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> a_6;
  string a_5;
  uint64_t a_4;
  uint32_t a_3;
  uint16_t a_2;
  uint8_t a_1;
  int a;
  int i;
  int strl;
  string format;
  TrodesMsg *msg;
  proxy<boost::python::api::item_policies> *in_stack_fffffffffffffb58;
  TrodesMsg *in_stack_fffffffffffffb60;
  allocator *in_stack_fffffffffffffb70;
  TrodesMsg *in_stack_fffffffffffffb80;
  allocator *paVar6;
  allocator *in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  result_type in_stack_fffffffffffffb9c;
  undefined6 in_stack_fffffffffffffba8;
  result_type in_stack_fffffffffffffbae;
  allocator *in_stack_fffffffffffffbb0;
  uint in_stack_fffffffffffffc04;
  string *in_stack_fffffffffffffc08;
  TrodesMsg *in_stack_fffffffffffffc10;
  string *in_stack_fffffffffffffc18;
  TrodesMsg *in_stack_fffffffffffffc20;
  string local_348 [39];
  allocator local_321;
  string local_320 [120];
  string local_2a8 [39];
  allocator local_281;
  string local_280 [88];
  result_type local_228;
  allocator local_219;
  string local_218 [88];
  result_type local_1c0;
  allocator local_1b9;
  string local_1b8 [92];
  result_type local_15c;
  allocator local_159;
  string local_158 [94];
  result_type local_fa;
  allocator local_f9;
  string local_f8 [88];
  result_type local_a0;
  int local_9c;
  int local_98;
  string local_40 [39];
  byte local_19;
  
  local_19 = 0;
  TrodesMsg::TrodesMsg(in_stack_fffffffffffffb80);
  boost::python::
  extract<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::extract
            ((extract<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffb60,&in_stack_fffffffffffffb58->m_target);
  pbVar3 = boost::python::extract::operator_cast_to_string_
                     ((extract<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x38ad7b);
  std::__cxx11::string::string(local_40,(string *)pbVar3);
  boost::python::
  extract<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~extract((extract<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x38ada9);
  local_98 = std::__cxx11::string::length();
  for (local_9c = 0; local_9c < local_98; local_9c = local_9c + 1) {
    puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_40);
    switch(*puVar4) {
    case 0x31:
      boost::python::api::object_operators<boost::python::api::object>::operator[]<int>
                ((object_operators<boost::python::api::object> *)
                 CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                 (int *)in_stack_fffffffffffffb90);
      boost::python::api::proxy::operator_cast_to_object(in_stack_fffffffffffffb58);
      boost::python::extract<unsigned_char>::extract
                ((extract<unsigned_char> *)in_stack_fffffffffffffb60,
                 &in_stack_fffffffffffffb58->m_target);
      rVar1 = boost::python::extract::operator_cast_to_unsigned_char
                        ((extract<unsigned_char> *)0x38b091);
      boost::python::extract<unsigned_char>::~extract((extract<unsigned_char> *)0x38b0a4);
      boost::python::api::object::~object((object *)0x38b0b1);
      boost::python::api::proxy<boost::python::api::item_policies>::~proxy
                ((proxy<boost::python::api::item_policies> *)in_stack_fffffffffffffb60);
      in_stack_fffffffffffffbb0 = &local_159;
      local_fa = rVar1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_158,"1",in_stack_fffffffffffffbb0);
      TrodesMsg::addcontents<unsigned_char>
                (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                 (uchar)(in_stack_fffffffffffffc04 >> 0x18));
      std::__cxx11::string::~string(local_158);
      std::allocator<char>::~allocator((allocator<char> *)&local_159);
      break;
    case 0x32:
      boost::python::api::object_operators<boost::python::api::object>::operator[]<int>
                ((object_operators<boost::python::api::object> *)
                 CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                 (int *)in_stack_fffffffffffffb90);
      boost::python::api::proxy::operator_cast_to_object(in_stack_fffffffffffffb58);
      boost::python::extract<unsigned_short>::extract
                ((extract<unsigned_short> *)in_stack_fffffffffffffb60,
                 &in_stack_fffffffffffffb58->m_target);
      in_stack_fffffffffffffbae =
           boost::python::extract::operator_cast_to_unsigned_short
                     ((extract<unsigned_short> *)0x38b243);
      boost::python::extract<unsigned_short>::~extract((extract<unsigned_short> *)0x38b257);
      boost::python::api::object::~object((object *)0x38b264);
      boost::python::api::proxy<boost::python::api::item_policies>::~proxy
                ((proxy<boost::python::api::item_policies> *)in_stack_fffffffffffffb60);
      local_15c = in_stack_fffffffffffffbae;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b8,"2",&local_1b9);
      TrodesMsg::addcontents<unsigned_short>
                (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                 (unsigned_short)(in_stack_fffffffffffffc04 >> 0x10));
      std::__cxx11::string::~string(local_1b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
      break;
    default:
      break;
    case 0x34:
      boost::python::api::object_operators<boost::python::api::object>::operator[]<int>
                ((object_operators<boost::python::api::object> *)
                 CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                 (int *)in_stack_fffffffffffffb90);
      boost::python::api::proxy::operator_cast_to_object(in_stack_fffffffffffffb58);
      boost::python::extract<unsigned_int>::extract
                ((extract<unsigned_int> *)in_stack_fffffffffffffb60,
                 &in_stack_fffffffffffffb58->m_target);
      in_stack_fffffffffffffb9c =
           boost::python::extract::operator_cast_to_unsigned_int((extract<unsigned_int> *)0x38b3f8);
      boost::python::extract<unsigned_int>::~extract((extract<unsigned_int> *)0x38b40b);
      boost::python::api::object::~object((object *)0x38b418);
      boost::python::api::proxy<boost::python::api::item_policies>::~proxy
                ((proxy<boost::python::api::item_policies> *)in_stack_fffffffffffffb60);
      in_stack_fffffffffffffb90 = &local_219;
      local_1c0 = in_stack_fffffffffffffb9c;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_218,"4",in_stack_fffffffffffffb90);
      TrodesMsg::addcontents<unsigned_int>
                (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc04);
      std::__cxx11::string::~string(local_218);
      std::allocator<char>::~allocator((allocator<char> *)&local_219);
      break;
    case 0x38:
      boost::python::api::object_operators<boost::python::api::object>::operator[]<int>
                ((object_operators<boost::python::api::object> *)
                 CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                 (int *)in_stack_fffffffffffffb90);
      boost::python::api::proxy::operator_cast_to_object(in_stack_fffffffffffffb58);
      boost::python::extract<unsigned_long>::extract
                ((extract<unsigned_long> *)in_stack_fffffffffffffb60,
                 &in_stack_fffffffffffffb58->m_target);
      rVar5 = boost::python::extract::operator_cast_to_unsigned_long
                        ((extract<unsigned_long> *)0x38b5a9);
      boost::python::extract<unsigned_long>::~extract((extract<unsigned_long> *)0x38b5bd);
      boost::python::api::object::~object((object *)0x38b5ca);
      boost::python::api::proxy<boost::python::api::item_policies>::~proxy
                ((proxy<boost::python::api::item_policies> *)in_stack_fffffffffffffb60);
      paVar6 = &local_281;
      local_228 = rVar5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_280,"8",paVar6);
      TrodesMsg::addcontents<unsigned_long>
                (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                 (unsigned_long)in_stack_fffffffffffffc10);
      std::__cxx11::string::~string(local_280);
      std::allocator<char>::~allocator((allocator<char> *)&local_281);
      break;
    case 0x62:
      boost::python::api::object_operators<boost::python::api::object>::operator[]<int>
                ((object_operators<boost::python::api::object> *)
                 CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                 (int *)in_stack_fffffffffffffb90);
      boost::python::api::proxy::operator_cast_to_object(in_stack_fffffffffffffb58);
      boost::python::extract<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::extract
                ((extract<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                 in_stack_fffffffffffffb60,&in_stack_fffffffffffffb58->m_target);
      boost::python::extract::operator_cast_to_vector_
                ((extract<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)0x38b97b);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbb0,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT26(in_stack_fffffffffffffbae,in_stack_fffffffffffffba8));
      boost::python::extract<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~extract
                ((extract<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)0x38b9a3);
      boost::python::api::object::~object((object *)0x38b9b0);
      boost::python::api::proxy<boost::python::api::item_policies>::~proxy
                ((proxy<boost::python::api::item_policies> *)in_stack_fffffffffffffb60);
      in_stack_fffffffffffffb60 = (TrodesMsg *)&stack0xfffffffffffffc1f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffc20,"b",(allocator *)in_stack_fffffffffffffb60);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbb0,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT26(in_stack_fffffffffffffbae,in_stack_fffffffffffffba8));
      TrodesMsg::addcontents<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc10)
      ;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb70)
      ;
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffc20);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc1f);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb70)
      ;
      break;
    case 0x69:
      boost::python::api::object_operators<boost::python::api::object>::operator[]<int>
                ((object_operators<boost::python::api::object> *)
                 CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                 (int *)in_stack_fffffffffffffb90);
      boost::python::api::proxy::operator_cast_to_object(in_stack_fffffffffffffb58);
      boost::python::extract<int>::extract
                ((extract<int> *)in_stack_fffffffffffffb60,&in_stack_fffffffffffffb58->m_target);
      rVar2 = boost::python::extract::operator_cast_to_int((extract<int> *)0x38aee0);
      boost::python::extract<int>::~extract((extract<int> *)0x38aef3);
      boost::python::api::object::~object((object *)0x38af00);
      boost::python::api::proxy<boost::python::api::item_policies>::~proxy
                ((proxy<boost::python::api::item_policies> *)in_stack_fffffffffffffb60);
      local_a0 = rVar2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,"i",&local_f9);
      TrodesMsg::addcontents<int>
                (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc04);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      break;
    case 0x73:
      boost::python::api::object_operators<boost::python::api::object>::operator[]<int>
                ((object_operators<boost::python::api::object> *)
                 CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                 (int *)in_stack_fffffffffffffb90);
      boost::python::api::proxy::operator_cast_to_object(in_stack_fffffffffffffb58);
      boost::python::
      extract<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      extract((extract<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffb60,&in_stack_fffffffffffffb58->m_target);
      pbVar3 = boost::python::extract::operator_cast_to_string_
                         ((extract<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)0x38b75e);
      std::__cxx11::string::string(local_2a8,(string *)pbVar3);
      boost::python::
      extract<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~extract((extract<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x38b786);
      boost::python::api::object::~object((object *)0x38b793);
      boost::python::api::proxy<boost::python::api::item_policies>::~proxy
                ((proxy<boost::python::api::item_policies> *)in_stack_fffffffffffffb60);
      in_stack_fffffffffffffb70 = &local_321;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_320,"s",in_stack_fffffffffffffb70);
      std::__cxx11::string::string(local_348,local_2a8);
      TrodesMsg::addcontents<std::__cxx11::string>
                (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                 &in_stack_fffffffffffffc10->format);
      std::__cxx11::string::~string(local_348);
      std::__cxx11::string::~string(local_320);
      std::allocator<char>::~allocator((allocator<char> *)&local_321);
      std::__cxx11::string::~string(local_2a8);
    }
  }
  local_19 = 1;
  std::__cxx11::string::~string(local_40);
  if ((local_19 & 1) == 0) {
    TrodesMsg::~TrodesMsg(in_stack_fffffffffffffb60);
  }
  return in_RDI;
}

Assistant:

TrodesMsg new_TrodesMsg(str f, list& l){
    TrodesMsg msg;
    std::string format = extract<std::string>(f);
    int strl = format.length();
    for(int i = 0; i < strl; i++){
        switch (format[i]){
        case 'i':{
            int a = extract<int>(l[i]);
            msg.addcontents("i", a);
            break;}
        case '1':{
            uint8_t a = extract<uint8_t>(l[i]);
            msg.addcontents("1", a);
            break;}
        case '2':{
            uint16_t a = extract<uint16_t>(l[i]);
            msg.addcontents("2", a);
            break;}
        case '4':{
            uint32_t a = extract<uint32_t>(l[i]);
            msg.addcontents("4", a);
            break;}
        case '8':{
            uint64_t a = extract<uint64_t>(l[i]);
            msg.addcontents("8", a);
            break;}
        case 's':{
            std::string a = extract<std::string>(l[i]);
            msg.addcontents("s", a);
            break;}
        case 'b':{
            std::vector<byte> a = extract<std::vector<byte> >(l[i]);
            msg.addcontents("b", a);
            break;}
//            case 'n':{
//                NetworkDataType a;
//                msg.popcontents("n", a);
//                l.append(a);
//                break;}
        default:
            break;
        }
    }
    return msg;
}